

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashrate.cpp
# Opt level: O3

Value __thiscall xmrig::Hashrate::normalize(Hashrate *this,double d)

{
  undefined2 uVar1;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  double dVar2;
  Value VVar3;
  
  if ((uint)((long)ABS(d) + 0xfff0000000000000U >> 0x35) < 0x3ff) {
    dVar2 = floor(d * 100.0);
    this->m_top = (uint32_t *)0x0;
    this->m_threads = (size_t)(dVar2 * 0.01);
    uVar1 = 0x216;
    in_RDX = extraout_RDX;
  }
  else {
    this->m_threads = 0;
    this->m_top = (uint32_t *)0x0;
    uVar1 = 0;
  }
  *(undefined2 *)((long)&this->m_top + 6) = uVar1;
  VVar3.data_.s.str = (Ch *)in_RDX;
  VVar3.data_.n = (Number)this;
  return (Value)VVar3.data_;
}

Assistant:

rapidjson::Value xmrig::Hashrate::normalize(double d)
{
    using namespace rapidjson;

    if (!std::isnormal(d)) {
        return Value(kNullType);
    }

    return Value(floor(d * 100.0) / 100.0);
}